

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_decompress.c
# Opt level: O0

libdeflate_result
libdeflate_zlib_decompress_ex
          (libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,size_t out_nbytes_avail,
          size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  uint uVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint *puVar4;
  ulong in_RDX;
  ushort *in_RSI;
  long *in_R9;
  size_t *in_stack_00000008;
  libdeflate_result result;
  size_t actual_out_nbytes;
  size_t actual_in_nbytes;
  u16 hdr;
  u8 *in_end;
  u8 *in_next;
  u16 v;
  u32 v_1;
  u32 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  size_t in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  size_t *actual_out_nbytes_ret_00;
  libdeflate_result local_34;
  
  if (in_RDX < 6) {
    local_34 = LIBDEFLATE_BAD_DATA;
  }
  else {
    uVar2 = *in_RSI << 8 | *in_RSI >> 8;
    actual_out_nbytes_ret_00 = (size_t *)(in_RSI + 1);
    if ((uint)uVar2 % 0x1f == 0) {
      if (((int)(uint)uVar2 >> 8 & 0xfU) == 8) {
        if ((uint)((int)(uint)uVar2 >> 0xc) < 8) {
          if (((int)(uint)uVar2 >> 5 & 1U) == 0) {
            local_34 = libdeflate_deflate_decompress_ex
                                 ((libdeflate_decompressor *)
                                  CONCAT26(uVar2,in_stack_ffffffffffffff80),
                                  in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  (void *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68),
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                  in_stack_00000008,actual_out_nbytes_ret_00);
            if (local_34 == LIBDEFLATE_SUCCESS) {
              puVar4 = (uint *)((long)in_stack_ffffffffffffff78 + (long)actual_out_nbytes_ret_00);
              uVar3 = libdeflate_adler32(in_stack_ffffffffffffff60,in_stack_00000008,0x12bcc4);
              uVar1 = *puVar4;
              if (uVar3 == (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18)) {
                if (in_R9 != (long *)0x0) {
                  *in_R9 = (long)puVar4 + (4 - (long)in_RSI);
                }
                local_34 = LIBDEFLATE_SUCCESS;
              }
              else {
                local_34 = LIBDEFLATE_BAD_DATA;
              }
            }
          }
          else {
            local_34 = LIBDEFLATE_BAD_DATA;
          }
        }
        else {
          local_34 = LIBDEFLATE_BAD_DATA;
        }
      }
      else {
        local_34 = LIBDEFLATE_BAD_DATA;
      }
    }
    else {
      local_34 = LIBDEFLATE_BAD_DATA;
    }
  }
  return local_34;
}

Assistant:

libdeflate_result
libdeflate_zlib_decompress_ex(struct libdeflate_decompressor *d,
			      const void *in, size_t in_nbytes,
			      void *out, size_t out_nbytes_avail,
			      size_t *actual_in_nbytes_ret,
			      size_t *actual_out_nbytes_ret)
{
	const u8 *in_next = in;
	const u8 * const in_end = in_next + in_nbytes;
	u16 hdr;
	size_t actual_in_nbytes;
	size_t actual_out_nbytes;
	enum libdeflate_result result;

	if (in_nbytes < ZLIB_MIN_OVERHEAD)
		return LIBDEFLATE_BAD_DATA;

	/* 2 byte header: CMF and FLG  */
	hdr = get_unaligned_be16(in_next);
	in_next += 2;

	/* FCHECK */
	if ((hdr % 31) != 0)
		return LIBDEFLATE_BAD_DATA;

	/* CM */
	if (((hdr >> 8) & 0xF) != ZLIB_CM_DEFLATE)
		return LIBDEFLATE_BAD_DATA;

	/* CINFO */
	if ((hdr >> 12) > ZLIB_CINFO_32K_WINDOW)
		return LIBDEFLATE_BAD_DATA;

	/* FDICT */
	if ((hdr >> 5) & 1)
		return LIBDEFLATE_BAD_DATA;

	/* Compressed data  */
	result = libdeflate_deflate_decompress_ex(d, in_next,
					in_end - ZLIB_FOOTER_SIZE - in_next,
					out, out_nbytes_avail,
					&actual_in_nbytes, actual_out_nbytes_ret);
	if (result != LIBDEFLATE_SUCCESS)
		return result;

	if (actual_out_nbytes_ret)
		actual_out_nbytes = *actual_out_nbytes_ret;
	else
		actual_out_nbytes = out_nbytes_avail;

	in_next += actual_in_nbytes;

	/* ADLER32  */
	if (libdeflate_adler32(1, out, actual_out_nbytes) !=
	    get_unaligned_be32(in_next))
		return LIBDEFLATE_BAD_DATA;
	in_next += 4;

	if (actual_in_nbytes_ret)
		*actual_in_nbytes_ret = in_next - (u8 *)in;

	return LIBDEFLATE_SUCCESS;
}